

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

void d68000_movem_pd_32(void)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint in_EDI;
  int iVar8;
  char buffer [40];
  char local_58 [40];
  uint uVar7;
  
  uVar1 = dasm_read_imm_16(in_EDI);
  local_58[0] = '\0';
  uVar6 = 0;
  do {
    uVar7 = uVar6;
    if ((uVar1 >> ((byte)((byte)uVar6 ^ 0xf) & 0x1f) & 1) != 0) {
      iVar8 = 0;
      if (uVar6 != 7) {
        uVar2 = 6;
        if (6 < uVar6) {
          uVar2 = uVar6;
        }
        iVar8 = 0;
        uVar5 = uVar6;
        do {
          uVar7 = uVar5;
          if ((uVar1 >> ((byte)(0xe - (char)uVar5) & 0x1f) & 1) == 0) break;
          uVar5 = uVar5 + 1;
          iVar8 = iVar8 + 1;
          uVar7 = uVar2 + 1;
        } while (iVar8 != (uVar2 + 1) - uVar6);
      }
      if (local_58[0] != '\0') {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '/';
        (local_58 + sVar3)[1] = '\0';
      }
      sVar3 = strlen(local_58);
      sprintf(local_58 + sVar3,"D%d",(ulong)uVar6);
      if (iVar8 != 0) {
        sVar3 = strlen(local_58);
        sprintf(local_58 + sVar3,"-D%d",(ulong)(iVar8 + uVar6));
      }
    }
    uVar6 = uVar7 + 1;
  } while (uVar6 < 8);
  uVar6 = 0;
  do {
    uVar7 = uVar6;
    if ((uVar1 >> ((byte)((byte)uVar6 ^ 7) & 0x1f) & 1) != 0) {
      iVar8 = 0;
      if (uVar6 != 7) {
        uVar2 = 6;
        if (6 < uVar6) {
          uVar2 = uVar6;
        }
        iVar8 = 0;
        uVar5 = uVar6;
        do {
          uVar7 = uVar5;
          if ((uVar1 >> ((byte)(6 - (char)uVar5) & 0x1f) & 1) == 0) break;
          uVar5 = uVar5 + 1;
          iVar8 = iVar8 + 1;
          uVar7 = uVar2 + 1;
        } while (iVar8 != (uVar2 + 1) - uVar6);
      }
      if (local_58[0] != '\0') {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '/';
        (local_58 + sVar3)[1] = '\0';
      }
      sVar3 = strlen(local_58);
      sprintf(local_58 + sVar3,"A%d",(ulong)uVar6);
      if (iVar8 != 0) {
        sVar3 = strlen(local_58);
        sprintf(local_58 + sVar3,"-A%d",(ulong)(iVar8 + uVar6));
      }
    }
    uVar6 = uVar7 + 1;
    if (7 < uVar6) {
      pcVar4 = get_ea_mode_str(g_cpu_ir,2);
      sprintf(g_dasm_str,"movem.l %s, %s",local_58,pcVar4);
      return;
    }
  } while( true );
}

Assistant:

static void d68000_movem_pd_32(void)
{
	uint data = read_imm_16();
	char buffer[40];
	uint first;
	uint run_length;
	uint i;

	buffer[0] = 0;
	for(i=0;i<8;i++)
	{
		if(data&(1<<(15-i)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(15-(i+1)))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "D%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-D%d", first + run_length);
		}
	}
	for(i=0;i<8;i++)
	{
		if(data&(1<<(7-i)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(7-(i+1)))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "A%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-A%d", first + run_length);
		}
	}
	sprintf(g_dasm_str, "movem.l %s, %s", buffer, get_ea_mode_str_32(g_cpu_ir));
}